

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node,REF_INT ldim,REF_DBL *field)

{
  undefined1 auVar1 [16];
  int iVar2;
  REF_GLOB *pRVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  
  iVar2 = ref_node->max;
  if (0 < (long)iVar2) {
    lVar7 = 0;
    uVar6 = (uint)((uint)(ldim * -0x33333333) < 0x33333334) * 5;
    if (ldim < 6) {
      uVar6 = 0;
    }
    uVar9 = 6;
    if (0x2aaaaaaa <
        ((uint)(ldim * -0x55555555) >> 1 | (uint)((ldim * -0x55555555 & 1U) != 0) << 0x1f)) {
      uVar9 = (ulong)uVar6;
    }
    if (ldim < 7) {
      uVar9 = (ulong)uVar6;
    }
    pRVar3 = ref_node->global;
    pauVar8 = (undefined1 (*) [16])(field + 2);
    do {
      if (-1 < pRVar3[lVar7]) {
        if (4 < ldim) {
          auVar1 = *pauVar8;
          auVar4._8_4_ = auVar1._0_4_;
          auVar4._0_8_ = auVar1._8_8_;
          auVar4._12_4_ = auVar1._4_4_;
          *pauVar8 = auVar4;
        }
        if (uVar9 != 0) {
          auVar1 = *(undefined1 (*) [16])(*pauVar8 + uVar9 * 8);
          auVar5._8_4_ = auVar1._0_4_;
          auVar5._0_8_ = auVar1._8_8_;
          auVar5._12_4_ = auVar1._4_4_;
          *(undefined1 (*) [16])(*pauVar8 + uVar9 * 8) = auVar5;
        }
      }
      lVar7 = lVar7 + 1;
      pauVar8 = (undefined1 (*) [16])(*pauVar8 + (long)ldim * 8);
    } while (iVar2 != lVar7);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT node;
  REF_DBL temp;
  REF_INT nequ;

  nequ = 0;
  if (ldim > 5 && 0 == ldim % 5) nequ = 5;
  if (ldim > 6 && 0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    if (ldim >= 5) {
      temp = field[2 + ldim * node];
      field[2 + ldim * node] = field[3 + ldim * node];
      field[3 + ldim * node] = temp;
    }
    if (nequ > 0) {
      temp = field[nequ + 2 + ldim * node];
      field[nequ + 2 + ldim * node] = field[nequ + 3 + ldim * node];
      field[nequ + 3 + ldim * node] = temp;
    }
  }

  return REF_SUCCESS;
}